

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O3

char * despot::util::tinyxml::TiXmlBase::ReadText
                 (char *p,TiXmlString *text,bool trimWhiteSpace,char *endTag,bool caseInsensitive,
                 TiXmlEncoding encoding)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  undefined1 *puVar8;
  undefined7 in_register_00000011;
  long lVar9;
  size_type len_00;
  long lVar10;
  uint *str;
  char cArr [4];
  int len;
  uint local_40;
  int local_3c;
  undefined1 local_35;
  uint local_34;
  
  puVar8 = endTag;
  TiXmlString::assign(text,"",0);
  if (((int)CONCAT71(in_register_00000011,trimWhiteSpace) == 0) || (condenseWhiteSpace == '\0')) {
    if (p != (char *)0x0) {
      do {
        if ((*p == 0) ||
           (bVar4 = StringEqual(p,endTag,caseInsensitive,(TiXmlEncoding)puVar8), bVar4))
        goto LAB_00172140;
        local_40 = 0;
        if (encoding == TIXML_ENCODING_UTF8) {
          puVar8 = utf8ByteTable;
          iVar5 = *(int *)(utf8ByteTable + (ulong)(byte)*p * 4);
          lVar6 = (long)iVar5;
          local_3c = iVar5;
          if (lVar6 == 1) goto LAB_001720f7;
          if (iVar5 == 0) {
            TiXmlString::append(text,(char *)&local_40,0);
            return (char *)0x0;
          }
          puVar8 = (undefined1 *)CONCAT71(0x178d,*p);
          if (*p != 0) {
            lVar9 = 0;
            if (0 < lVar6) {
              lVar9 = lVar6;
            }
            lVar10 = 0;
            do {
              if (lVar9 == lVar10) break;
              *(char *)((long)&local_40 + lVar10) = (char)puVar8;
              lVar2 = lVar10 + 1;
              puVar8 = (undefined1 *)CONCAT71((int7)((ulong)puVar8 >> 8),((byte *)p)[lVar2]);
              lVar10 = lVar10 + 1;
            } while (((byte *)p)[lVar2] != 0);
          }
          p = (char *)((byte *)p + lVar6);
        }
        else {
          local_3c = 1;
LAB_001720f7:
          if (*p == 0x26) {
            puVar8 = (undefined1 *)(ulong)encoding;
            p = GetEntity(p,(char *)&local_40,&local_3c,encoding);
            iVar5 = local_3c;
          }
          else {
            local_40 = (uint)(byte)*p;
            p = (char *)((byte *)p + 1);
            iVar5 = 1;
          }
        }
        TiXmlString::append(text,(char *)&local_40,(long)iVar5);
      } while ((byte *)p != (byte *)0x0);
    }
  }
  else {
    p = SkipWhiteSpace(p,encoding);
    if ((byte *)p != (byte *)0x0) {
      local_34 = (uint)caseInsensitive;
      bVar4 = false;
      do {
        if ((*p == 0) ||
           (bVar3 = StringEqual(p,endTag,SUB41(local_34,0),(TiXmlEncoding)puVar8), bVar3)) {
LAB_00172140:
          sVar7 = strlen(endTag);
          return (char *)((byte *)p + sVar7);
        }
        bVar1 = *p;
        if ((((bVar1 == 0xd) || (bVar1 == 10)) || (iVar5 = isspace((uint)bVar1), bVar1 == 0xd)) ||
           (iVar5 != 0)) {
          p = (char *)((byte *)p + 1);
          bVar4 = true;
        }
        else {
          if (bVar4) {
            local_3c = CONCAT31(local_3c._1_3_,0x20);
            TiXmlString::append(text,(char *)&local_3c,1);
          }
          local_40 = 0;
          if (encoding == TIXML_ENCODING_UTF8) {
            puVar8 = utf8ByteTable;
            iVar5 = *(int *)(utf8ByteTable + (ulong)(byte)*p * 4);
            lVar6 = (long)iVar5;
            local_3c = iVar5;
            if (lVar6 != 0) {
              if (iVar5 == 1) goto LAB_00171ffe;
              puVar8 = (undefined1 *)CONCAT71(0x178d,*p);
              if (*p != 0) {
                lVar9 = 0;
                if (0 < lVar6) {
                  lVar9 = lVar6;
                }
                lVar10 = 0;
                do {
                  if (lVar9 == lVar10) break;
                  *(char *)((long)&local_40 + lVar10) = (char)puVar8;
                  lVar2 = lVar10 + 1;
                  puVar8 = (undefined1 *)CONCAT71((int7)((ulong)puVar8 >> 8),((byte *)p)[lVar2]);
                  lVar10 = lVar10 + 1;
                } while (((byte *)p)[lVar2] != 0);
              }
              p = (char *)((byte *)p + lVar6);
              goto LAB_00172020;
            }
            p = (char *)0x0;
LAB_00172048:
            len_00 = (size_type)iVar5;
            str = &local_40;
          }
          else {
            local_3c = 1;
LAB_00171ffe:
            if (*p == 0x26) {
              puVar8 = (undefined1 *)(ulong)encoding;
              p = GetEntity(p,(char *)&local_40,&local_3c,encoding);
              iVar5 = local_3c;
LAB_00172020:
              if (iVar5 != 1) goto LAB_00172048;
            }
            else {
              local_40 = (uint)(byte)*p;
              p = (char *)((byte *)p + 1);
            }
            local_35 = (undefined1)local_40;
            len_00 = 1;
            str = (uint *)&local_35;
          }
          TiXmlString::append(text,(char *)str,len_00);
          bVar4 = false;
        }
      } while ((byte *)p != (byte *)0x0);
    }
  }
  return (char *)0x0;
}

Assistant:

const char* TiXmlBase::ReadText(const char* p, TIXML_STRING * text,
	bool trimWhiteSpace, const char* endTag, bool caseInsensitive,
	TiXmlEncoding encoding) {
	*text = "";
	if (!trimWhiteSpace // certain tags always keep whitespace
	|| !condenseWhiteSpace) // if true, whitespace is always kept
		{
		// Keep all the white space.
		while (p && *p && !StringEqual(p, endTag, caseInsensitive, encoding)) {
			int len;
			char cArr[4] = { 0, 0, 0, 0 };
			p = GetChar(p, cArr, &len, encoding);
			text->append(cArr, len);
		}
	} else {
		bool whitespace = false;

		// Remove leading white space:
		p = SkipWhiteSpace(p, encoding);
		while (p && *p && !StringEqual(p, endTag, caseInsensitive, encoding)) {
			if (*p == '\r' || *p == '\n') {
				whitespace = true;
				++p;
			} else if (IsWhiteSpace(*p)) {
				whitespace = true;
				++p;
			} else {
				// If we've found whitespace, add it before the
				// new character. Any whitespace just becomes a space.
				if (whitespace) {
					(*text) += ' ';
					whitespace = false;
				}
				int len;
				char cArr[4] = { 0, 0, 0, 0 };
				p = GetChar(p, cArr, &len, encoding);
				if (len == 1)
					(*text) += cArr[0]; // more efficient
				else
					text->append(cArr, len);
			}
		}
	}
	if (p)
		p += strlen(endTag);
	return p;
}